

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall pstore::command_line::literal::~literal(literal *this)

{
  literal *this_local;
  
  std::__cxx11::string::~string((string *)&this->description);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

literal () = default;